

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.cpp
# Opt level: O0

_Bool ggml_backend_cpu_device_supports_op(ggml_backend_dev_t dev,ggml_tensor *op)

{
  ggml_type gVar1;
  long *plVar2;
  _Bool _Var3;
  uint uVar4;
  reference ppgVar5;
  ulong uVar6;
  ggml_type_traits_cpu *pgVar7;
  int *in_RSI;
  undefined8 in_RDI;
  float max_bias;
  int i;
  extra_buffer_type *buf_extra;
  ggml_backend_buffer_type *extra;
  iterator __end1;
  iterator __begin1;
  vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_> *__range1;
  ggml_tensor *src1;
  ggml_tensor *src0;
  vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>
  *in_stack_ffffffffffffff88;
  undefined5 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff95;
  undefined1 in_stack_ffffffffffffff96;
  undefined1 in_stack_ffffffffffffff97;
  bool local_62;
  bool local_61;
  int local_54;
  __normal_iterator<ggml_backend_buffer_type_**,_std::vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>_>
  local_38;
  vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_> *local_30;
  ggml_type *local_28;
  ggml_type *local_20;
  int *local_18;
  undefined8 local_10;
  bool local_1;
  
  local_20 = *(ggml_type **)(in_RSI + 0x26);
  local_28 = *(ggml_type **)(in_RSI + 0x28);
  if ((((in_RSI[0x14] == 0) || (in_RSI[0x14] == 0x22)) || (in_RSI[0x14] == 0x23)) ||
     ((in_RSI[0x14] == 0x24 || (in_RSI[0x14] == 0x25)))) {
    local_1 = true;
  }
  else {
    local_18 = in_RSI;
    local_10 = in_RDI;
    local_30 = ggml_backend_cpu_get_extra_buffers_type();
    local_38._M_current =
         (ggml_backend_buffer_type **)
         std::vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>::begin
                   (in_stack_ffffffffffffff88);
    std::vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>::end
              (in_stack_ffffffffffffff88);
    while (_Var3 = __gnu_cxx::operator!=
                             ((__normal_iterator<ggml_backend_buffer_type_**,_std::vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>_>
                               *)CONCAT17(in_stack_ffffffffffffff97,
                                          CONCAT16(in_stack_ffffffffffffff96,
                                                   CONCAT15(in_stack_ffffffffffffff95,
                                                            in_stack_ffffffffffffff90))),
                              (__normal_iterator<ggml_backend_buffer_type_**,_std::vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>_>
                               *)in_stack_ffffffffffffff88), _Var3) {
      ppgVar5 = __gnu_cxx::
                __normal_iterator<ggml_backend_buffer_type_**,_std::vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>_>
                ::operator*(&local_38);
      if (((*ppgVar5 != (ggml_backend_buffer_type *)0x0) &&
          (plVar2 = (long *)(*ppgVar5)->context, plVar2 != (long *)0x0)) &&
         (uVar6 = (**(code **)(*plVar2 + 0x10))(plVar2,local_10,local_18), (uVar6 & 1) != 0)) {
        return true;
      }
      __gnu_cxx::
      __normal_iterator<ggml_backend_buffer_type_**,_std::vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>_>
      ::operator++(&local_38);
    }
    for (local_54 = 0; local_54 < 10; local_54 = local_54 + 1) {
      if (((*(long *)(local_18 + (long)local_54 * 2 + 0x26) != 0) &&
          (*(long *)(*(long *)(local_18 + (long)local_54 * 2 + 0x26) + 8) != 0)) &&
         (uVar6 = ggml_backend_buft_is_host
                            (*(undefined8 *)
                              (*(long *)(*(long *)(local_18 + (long)local_54 * 2 + 0x26) + 8) + 0x48
                              )), (uVar6 & 1) == 0)) {
        return false;
      }
    }
    switch(local_18[0x14]) {
    case 0x1b:
      local_62 = true;
      if (*local_28 != GGML_TYPE_F32) {
        gVar1 = *local_28;
        pgVar7 = ggml_get_type_traits_cpu(*local_20);
        local_62 = gVar1 == pgVar7->vec_dot_type;
      }
      local_1 = local_62;
      break;
    default:
      local_1 = true;
      break;
    case 0x1d:
      if (*local_20 != GGML_TYPE_F32) {
        uVar4 = ggml_is_quantized(*local_20);
        if ((uVar4 & 1) == 0) {
          return false;
        }
        if (*(undefined8 *)(local_20 + 8) != *(undefined8 *)(local_28 + 8)) {
          return false;
        }
        if (*(undefined8 *)(local_20 + 10) != *(undefined8 *)(local_28 + 10)) {
          return false;
        }
      }
      local_1 = false;
      if (*local_28 == GGML_TYPE_F32) {
        local_1 = *local_18 == 0;
      }
      break;
    case 0x20:
      local_61 = false;
      if (((*local_18 != 0x12) && (local_61 = false, *local_18 != 0x15)) &&
         ((local_61 = false, *local_18 != 0x10 &&
          (((local_61 = false, *local_18 != 0x11 && (local_61 = false, *local_18 != 0x16)) &&
           (local_61 = false, *local_18 != 0x13)))))) {
        local_61 = *local_18 != 0x1d;
      }
      local_1 = local_61;
      break;
    case 0x27:
      local_1 = true;
      if (*local_20 != GGML_TYPE_F32) {
        local_1 = *local_20 == GGML_TYPE_F16;
      }
      break;
    case 0x2c:
      if ((**(int **)(local_18 + 0x26) == 0) && (**(int **)(local_18 + 0x28) == 0)) {
        local_1 = (float)local_18[0x16] == 0.0;
      }
      else {
        local_1 = false;
      }
      break;
    case 0x32:
      local_1 = false;
      if (*local_20 == GGML_TYPE_F32) {
        local_1 = *local_28 == GGML_TYPE_F32;
      }
    }
  }
  return local_1;
}

Assistant:

static bool ggml_backend_cpu_device_supports_op(ggml_backend_dev_t dev, const struct ggml_tensor * op) {
    const struct ggml_tensor * src0 = op->src[0];
    const struct ggml_tensor * src1 = op->src[1];

    if (op->op == GGML_OP_NONE || op->op == GGML_OP_RESHAPE || op->op == GGML_OP_VIEW || op->op == GGML_OP_PERMUTE || op->op == GGML_OP_TRANSPOSE) {
        return true;
    }

    // extra_buffer_op?
    for (auto extra : ggml_backend_cpu_get_extra_buffers_type()) {
        if (extra) {
            auto buf_extra = (ggml::cpu::extra_buffer_type*) extra->context;
            if (buf_extra && buf_extra->supports_op(dev, op)) {
                return true;
            }
        }
    }

    // the other case need host buffer.
    for (int i = 0; i < GGML_MAX_SRC; i++) {
        if (op->src[i] && op->src[i]->buffer && !ggml_backend_buft_is_host(op->src[i]->buffer->buft)) {
            return false;
        }
    }

    switch (op->op) {
        case GGML_OP_CPY:
            return
                op->type != GGML_TYPE_IQ3_XXS &&
                op->type != GGML_TYPE_IQ3_S   &&
                op->type != GGML_TYPE_IQ2_XXS &&
                op->type != GGML_TYPE_IQ2_XS  &&
                op->type != GGML_TYPE_IQ2_S   &&
                op->type != GGML_TYPE_IQ1_S   &&
                op->type != GGML_TYPE_IQ1_M; // missing type_traits.from_float
        case GGML_OP_MUL_MAT:
            return src1->type == GGML_TYPE_F32 || src1->type == ggml_get_type_traits_cpu(src0->type)->vec_dot_type;
        case GGML_OP_SOFT_MAX_BACK: {
            if (op->src[0]->type != GGML_TYPE_F32 || op->src[1]->type != GGML_TYPE_F32) {
                return false;
            }
            float max_bias = 0.0f;

            memcpy(&max_bias, (const float *) op->op_params + 1, sizeof(float));

            return max_bias == 0.0f;
        }
        case GGML_OP_IM2COL_BACK:
            return src0->type == GGML_TYPE_F32 && src1->type == GGML_TYPE_F32;
        case GGML_OP_GET_ROWS_BACK:
            return src0->type == GGML_TYPE_F32 || src0->type == GGML_TYPE_F16;
        case GGML_OP_OUT_PROD:
            return (src0->type == GGML_TYPE_F32 || (ggml_is_quantized(src0->type) && src0->ne[2] == src1->ne[2] && src0->ne[3] == src1->ne[3])) &&
                src1->type == GGML_TYPE_F32 && op->type == GGML_TYPE_F32;
        default:
            return true;
    }
}